

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O3

iterator * __thiscall
google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::
InsertUnique(iterator *__return_storage_ptr__,InnerMap *this,size_type b,Node *node)

{
  void **ppvVar1;
  Node *pNVar2;
  ulong uVar3;
  Node *pNVar4;
  pair<std::_Rb_tree_iterator<google::protobuf::MapKey_*>,_bool> pVar5;
  Node *local_28;
  
  ppvVar1 = this->table_;
  pNVar2 = (Node *)ppvVar1[b];
  if (pNVar2 == (Node *)0x0) {
    node->next = (Node *)0x0;
    ppvVar1[b] = node;
LAB_00299e71:
    uVar3 = this->index_of_first_non_null_;
    if (b < this->index_of_first_non_null_) {
      uVar3 = b;
    }
    this->index_of_first_non_null_ = uVar3;
  }
  else {
    local_28 = node;
    if (pNVar2 == (Node *)ppvVar1[b ^ 1]) {
      node->next = (Node *)0x0;
      pVar5 = std::
              _Rb_tree<google::protobuf::MapKey*,google::protobuf::MapKey*,std::_Identity<google::protobuf::MapKey*>,google::protobuf::Map<google::protobuf::MapKey,google::protobuf::MapValueRef>::InnerMap::KeyCompare,google::protobuf::Map<google::protobuf::MapKey,google::protobuf::MapValueRef>::MapAllocator<google::protobuf::MapKey*>>
              ::_M_insert_unique<google::protobuf::MapKey*>
                        ((_Rb_tree<google::protobuf::MapKey*,google::protobuf::MapKey*,std::_Identity<google::protobuf::MapKey*>,google::protobuf::Map<google::protobuf::MapKey,google::protobuf::MapValueRef>::InnerMap::KeyCompare,google::protobuf::Map<google::protobuf::MapKey,google::protobuf::MapValueRef>::MapAllocator<google::protobuf::MapKey*>>
                          *)ppvVar1[b],(MapKey **)&local_28);
      b = b & 0xfffffffffffffffe;
      __return_storage_ptr__->node_ = *(Node **)(pVar5.first._M_node._M_node + 1);
      goto LAB_00299ea8;
    }
    uVar3 = 0;
    pNVar4 = pNVar2;
    do {
      uVar3 = uVar3 + 1;
      pNVar4 = pNVar4->next;
    } while (pNVar4 != (Node *)0x0);
    if (7 < uVar3) {
      TreeConvert(this,b);
      node->next = (Node *)0x0;
      pVar5 = std::
              _Rb_tree<google::protobuf::MapKey*,google::protobuf::MapKey*,std::_Identity<google::protobuf::MapKey*>,google::protobuf::Map<google::protobuf::MapKey,google::protobuf::MapValueRef>::InnerMap::KeyCompare,google::protobuf::Map<google::protobuf::MapKey,google::protobuf::MapValueRef>::MapAllocator<google::protobuf::MapKey*>>
              ::_M_insert_unique<google::protobuf::MapKey*>
                        ((_Rb_tree<google::protobuf::MapKey*,google::protobuf::MapKey*,std::_Identity<google::protobuf::MapKey*>,google::protobuf::Map<google::protobuf::MapKey,google::protobuf::MapValueRef>::InnerMap::KeyCompare,google::protobuf::Map<google::protobuf::MapKey,google::protobuf::MapValueRef>::MapAllocator<google::protobuf::MapKey*>>
                          *)this->table_[b],(MapKey **)&local_28);
      b = b & 0xfffffffffffffffe;
      node = *(Node **)(pVar5.first._M_node._M_node + 1);
      goto LAB_00299e71;
    }
    node->next = pNVar2;
    ppvVar1[b] = node;
  }
  __return_storage_ptr__->node_ = node;
LAB_00299ea8:
  __return_storage_ptr__->m_ = this;
  __return_storage_ptr__->bucket_index_ = b;
  return __return_storage_ptr__;
}

Assistant:

iterator InsertUnique(size_type b, Node* node) {
      GOOGLE_DCHECK(index_of_first_non_null_ == num_buckets_ ||
             table_[index_of_first_non_null_] != NULL);
      // In practice, the code that led to this point may have already
      // determined whether we are inserting into an empty list, a short list,
      // or whatever.  But it's probably cheap enough to recompute that here;
      // it's likely that we're inserting into an empty or short list.
      iterator result;
      GOOGLE_DCHECK(find(*KeyPtrFromNodePtr(node)) == end());
      if (TableEntryIsEmpty(b)) {
        result = InsertUniqueInList(b, node);
      } else if (TableEntryIsNonEmptyList(b)) {
        if (PROTOBUF_PREDICT_FALSE(TableEntryIsTooLong(b))) {
          TreeConvert(b);
          result = InsertUniqueInTree(b, node);
          GOOGLE_DCHECK_EQ(result.bucket_index_, b & ~static_cast<size_type>(1));
        } else {
          // Insert into a pre-existing list.  This case cannot modify
          // index_of_first_non_null_, so we skip the code to update it.
          return InsertUniqueInList(b, node);
        }
      } else {
        // Insert into a pre-existing tree.  This case cannot modify
        // index_of_first_non_null_, so we skip the code to update it.
        return InsertUniqueInTree(b, node);
      }
      // parentheses around (std::min) prevents macro expansion of min(...)
      index_of_first_non_null_ =
          (std::min)(index_of_first_non_null_, result.bucket_index_);
      return result;
    }